

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sliding_puzzle.cpp
# Opt level: O2

void __thiscall
sliding_puzzle::SlidingPuzzle::SlidingPuzzle(SlidingPuzzle *this,int size,int anchor)

{
  double dVar1;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  time_t tVar5;
  int i;
  int iVar6;
  ulong uVar7;
  pointer __src;
  long lVar8;
  int j;
  long lVar9;
  int local_5c;
  vector<int,_std::allocator<int>_> start_tiles;
  
  (this->explored_)._M_h._M_buckets = &(this->explored_)._M_h._M_single_bucket;
  (this->explored_)._M_h._M_bucket_count = 1;
  (this->explored_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->explored_)._M_h._M_element_count = 0;
  (this->explored_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->heuristic_weight_).
  super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->heuristic_weight_).
  super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->heuristic_weight_).
  super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->explored_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->explored_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->start_).super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->start_).super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->goal_).super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->goal_).super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (SlidingPuzzle(int,int)::seed_once == '\0') {
    SlidingPuzzle(int,int)::seed_once = '\x01';
    tVar5 = time((time_t *)0x0);
    srand((uint)tVar5);
  }
  hash_time = 0;
  puzzle_size = size;
  puzzle_anchor = anchor;
  this->num_inadmissible_heuristic_ = 4;
  this->heuristic_weight_range_[0] = 1.0;
  this->heuristic_weight_range_[1] = 5.0;
  iVar4 = 4;
  for (iVar6 = 0; iVar6 < iVar4; iVar6 = iVar6 + 1) {
    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
      dVar1 = this->heuristic_weight_range_[0];
      iVar4 = rand();
      (&start_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start)[lVar9] =
           (pointer)((double)iVar4 /
                     (2147483647.0 /
                     (this->heuristic_weight_range_[1] - this->heuristic_weight_range_[0])) + dVar1)
      ;
    }
    std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::push_back
              (&this->heuristic_weight_,(value_type *)&start_tiles);
    iVar4 = this->num_inadmissible_heuristic_;
  }
  std::make_shared<sliding_puzzle::SlidingPuzzleState>();
  std::__shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->start_).
              super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2> *)
             &start_tiles);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &start_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish);
  std::make_shared<sliding_puzzle::SlidingPuzzleState>();
  std::__shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->goal_).
              super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2> *)
             &start_tiles);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &start_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish);
  uVar7 = 1;
  iVar4 = puzzle_size;
  for (lVar9 = 0; lVar9 < iVar4; lVar9 = lVar9 + 1) {
    peVar2 = (this->goal_).
             super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    for (lVar8 = 0; lVar8 < iVar4; lVar8 = lVar8 + 1) {
      *(int *)(*(long *)((long)(peVar2->state_).
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar9 * 0x18) + lVar8 * 4
              ) = (int)((long)((ulong)(uint)((int)(uVar7 + lVar8) >> 0x1f) << 0x20 |
                              uVar7 + lVar8 & 0xffffffff) %
                       (long)(int)((double)iVar4 * (double)iVar4));
      iVar4 = puzzle_size;
    }
    uVar7 = (ulong)(uint)((int)uVar7 + (int)lVar8);
  }
  start_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  start_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  start_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  for (local_5c = 0; local_5c < iVar4 * iVar4; local_5c = local_5c + 1) {
    std::vector<int,_std::allocator<int>_>::push_back(&start_tiles,&local_5c);
    iVar4 = puzzle_size;
  }
  for (lVar9 = 0; lVar9 < iVar4; lVar9 = lVar9 + 1) {
    for (lVar8 = 0; lVar8 < iVar4; lVar8 = lVar8 + 1) {
      iVar4 = rand();
      iVar4 = (int)((ulong)(long)iVar4 %
                   (ulong)((long)start_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)start_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 2));
      __src = start_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + iVar4 + 1;
      *(int *)(*(long *)((long)(((this->start_).
                                 super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->state_).
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar9 * 0x18) + lVar8 * 4
              ) = start_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar4];
      if (__src != start_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish) {
        memmove(start_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + iVar4,__src,
                (long)start_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)__src);
      }
      start_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = start_tiles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
      iVar4 = puzzle_size;
    }
  }
  bVar3 = generateSolvableStartState(this,0x2ee);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&start_tiles.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
  ~_Vector_base(&(this->heuristic_weight_).
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->goal_).
              super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->start_).
              super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  _Hashtable<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)this);
  _Unwind_Resume(bVar3);
}

Assistant:

SlidingPuzzle::SlidingPuzzle(int size, int anchor)
{
  static bool seed_once = true;
  if (seed_once)
  {
    seed_once = false;
    srand(time(NULL));
  }
  
  puzzle_size = size;
  puzzle_anchor = anchor;
  
  hash_time = 0;
  
  // Multi heuristic params
  num_inadmissible_heuristic_ = 4;
  heuristic_weight_range_[0] = 1.0;
  heuristic_weight_range_[1] = 5.0;
  for (int i=0; i<num_inadmissible_heuristic_; ++i)
  {
    std::array<double,3> weight;
    for (int j=0; j<3; ++j)
    {
      weight[j] = heuristic_weight_range_[0] +
        static_cast<double>(rand())/
          (RAND_MAX/(heuristic_weight_range_[1]-heuristic_weight_range_[0]));
    }
    heuristic_weight_.push_back(weight);
  }
  
  start_ = std::make_shared<SlidingPuzzleState>();
  goal_ = std::make_shared<SlidingPuzzleState>();
  int value = 1;
  for (int i=0; i<puzzle_size; ++i)
  {
    for (int j=0; j<puzzle_size; ++j)
    {
      goal_->state_[i][j] = value % static_cast<int>(pow(puzzle_size,2));
      ++value;
    }
  }

  // Random start state
  std::vector<int> start_tiles;
  for (int i=0; i<puzzle_size*puzzle_size; ++i)
  {
    start_tiles.push_back(i);
  }
  
  for (int i=0; i<puzzle_size; ++i)
  {
    for (int j=0; j<puzzle_size; ++j)
    {
      int index = rand() % start_tiles.size();
      start_->state_[i][j] = start_tiles[index];
      start_tiles.erase(start_tiles.begin()+index);
    }
  }

  generateSolvableStartState(750);

  std::cout << "The random start state is: " << std::endl;
  std::cout << *start_ << std::endl;

}